

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

void __thiscall Fl_Browser::Fl_Browser(Fl_Browser *this,int X,int Y,int W,int H,char *L)

{
  Fl_Browser_::Fl_Browser_(&this->super_Fl_Browser_,X,Y,W,H,L);
  (this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Browser_002766e0;
  this->column_widths_ = no_columns;
  this->full_height_ = 0;
  this->format_char_ = '@';
  this->column_char_ = '\t';
  this->first = (FL_BLINE *)0x0;
  this->last = (FL_BLINE *)0x0;
  this->cache = (FL_BLINE *)0x0;
  this->cacheline = 0;
  this->lines = 0;
  return;
}

Assistant:

Fl_Browser::Fl_Browser(int X, int Y, int W, int H, const char *L)
: Fl_Browser_(X, Y, W, H, L) {
  column_widths_ = no_columns;
  lines = 0;
  full_height_ = 0;
  cacheline = 0;
  format_char_ = '@';
  column_char_ = '\t';
  first = last = cache = 0;
}